

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  iterator pSVar1;
  SourceLocation *in_RSI;
  SmallVectorBase<slang::SourceLocation> *in_RDI;
  SourceLocation *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::SourceLocation> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::SourceLocation_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pSVar1 = end(in_RDI);
    *pSVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }